

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O2

void qsoundc_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  qsound_delay *d;
  size_t __n;
  short sVar1;
  char cVar2;
  short sVar3;
  INT16 IVar4;
  short sVar5;
  UINT16 UVar6;
  ushort uVar7;
  UINT16 UVar8;
  undefined2 uVar9;
  INT32 IVar10;
  INT32 IVar11;
  INT16 *pIVar12;
  undefined2 uVar13;
  uint uVar14;
  undefined2 uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  UINT16 *pUVar21;
  ulong uVar22;
  INT16 *pIVar23;
  undefined2 uVar24;
  int iVar25;
  undefined2 uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  qsound_delay *d_00;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  pIVar23 = (INT16 *)0x0;
  memset(outputs[1],0,__n);
  for (uVar22 = 0; uVar22 != samples; uVar22 = uVar22 + 1) {
    sVar5 = *(short *)((long)param + 0x1490);
    if (sVar5 == 0x39) {
      for (lVar20 = 0; lVar20 != 0x310; lVar20 = lVar20 + 0x188) {
        *(undefined8 *)((long)param + lVar20 + 0xcb8) = 0x5f;
        pIVar12 = get_filter_table((qsound_chip *)(ulong)*(ushort *)((long)param + lVar20 + 0xcc0),
                                   (UINT16)pIVar23);
        if (pIVar12 != (INT16 *)0x0) {
          memcpy((void *)((long)param + lVar20 + 0xcc2),pIVar12,0xbe);
          pIVar23 = pIVar12;
        }
      }
      *(undefined4 *)((long)param + 0x1490) = 0x3140314;
    }
    else if ((sVar5 == 0x6b2) || (sVar5 == 0x314)) {
      sVar3 = -0x554;
      if (sVar5 == 0x6b2) {
        sVar3 = -0x53c;
      }
      *(undefined1 *)((long)param + 0x149c) = 0x80;
      sVar3 = sVar3 + *(short *)((long)param + 0x4ae);
      lVar20 = 0;
      sVar5 = 0;
      if (0 < sVar3) {
        sVar5 = sVar3;
      }
      if (0x3ff < sVar5) {
        sVar5 = 0x400;
      }
      *(short *)((long)param + 0x4b2) = sVar5;
      uVar16 = *(uint *)((long)param + 0x18);
      lVar28 = 0x488;
      iVar25 = 0;
      for (; lVar20 != 0x10; lVar20 = lVar20 + 1) {
        if ((uVar16 >> ((uint)lVar20 & 0x1f) & 1) == 0) {
          sVar5 = *(short *)((long)param + lVar28 * 8 + -0x2102);
          UVar6 = *(UINT16 *)((long)param + lVar28 * 8 + -0x210c);
          IVar4 = get_sample((qsound_chip *)param,*(UINT16 *)((long)param + lVar28 * 8 + -0x210e),
                             UVar6);
          uVar14 = (uint)(*(ushort *)((long)param + lVar28 * 8 + -0x210a) >> 4) +
                   (short)UVar6 * 0x1000 + (uint)*(ushort *)((long)param + lVar28 * 8 + -0x2108);
          if ((int)*(short *)((long)param + lVar28 * 8 + -0x2104) <= (int)uVar14 >> 0xc) {
            uVar14 = uVar14 + *(short *)((long)param + lVar28 * 8 + -0x2106) * -0x1000;
          }
          sVar5 = (short)((uint)((int)IVar4 * (int)sVar5) >> 0xe);
          iVar25 = iVar25 + (int)*(short *)((long)param + lVar28 * 8 + -0x2100) * (int)sVar5 * 4;
          if ((int)uVar14 < -0x7ffffff) {
            uVar14 = 0xf8000000;
          }
          if (0x7fffffe < (int)uVar14) {
            uVar14 = 0x7ffffff;
          }
          *(short *)((long)param + lVar28 * 8 + -0x210c) = (short)(uVar14 >> 0xc);
          *(short *)((long)param + lVar28 * 8 + -0x210a) = (short)(uVar14 << 4);
        }
        else {
          sVar5 = 0;
        }
        *(short *)((long)param + lVar28) = sVar5;
        lVar28 = lVar28 + 2;
      }
      pIVar23 = (INT16 *)0x3;
      iVar19 = *(int *)((long)param + 0x1498) % 3;
      uVar14 = iVar19 + 0x10;
      uVar29 = (ulong)uVar14;
      if ((uVar16 >> (uVar14 & 0x1f) & 1) == 0) {
        pUVar21 = (UINT16 *)((long)param + (long)iVar19 * 0x10 + 0x432);
        if (*(int *)((long)param + 0x1498) + 2U < 5) {
          UVar6 = pUVar21[7];
          if (UVar6 == pUVar21[1]) {
            pUVar21[5] = 0;
          }
          if (pUVar21[4] != 0) {
            *(undefined2 *)((long)param + uVar29 * 2 + 0x488) = 0;
            pUVar21[4] = 0;
            pUVar21[6] = 10;
            UVar6 = *pUVar21;
            pUVar21[5] = pUVar21[3];
            pUVar21[7] = UVar6;
          }
          IVar4 = get_sample((qsound_chip *)param,pUVar21[2],UVar6);
          cVar2 = (char)((ushort)IVar4 >> 8);
        }
        else {
          UVar6 = pUVar21[7];
          pUVar21[7] = UVar6 + 1;
          uVar7 = get_sample((qsound_chip *)param,pUVar21[2],UVar6);
          cVar2 = (char)(uVar7 >> 4);
        }
        iVar19 = (int)cVar2 >> 4;
        uVar16 = iVar19 * -2;
        if (iVar19 * -2 < 0) {
          uVar16 = iVar19 * 2;
        }
        UVar6 = pUVar21[6];
        iVar17 = (int)((uVar16 | 1) * (int)(short)UVar6) >> 1;
        iVar18 = -iVar17;
        if (0 < iVar19) {
          iVar18 = iVar17;
        }
        iVar18 = *(short *)((long)param + uVar29 * 2 + 0x488) + iVar18;
        if (iVar18 < -0x7fff) {
          iVar18 = -0x8000;
        }
        if (0x7ffe < iVar18) {
          iVar18 = 0x7fff;
        }
        pIVar23 = (INT16 *)(ulong)((uint)((short)pUVar21[5] * iVar18) >> 0x10);
        *(short *)((long)param + uVar29 * 2 + 0x488) =
             (short)((uint)((short)pUVar21[5] * iVar18) >> 0x10);
        UVar8 = (UINT16)((uint)((int)adpcm_step_table[iVar19 + 8] * (int)(short)UVar6) >> 6);
        UVar6 = UVar8;
        if ((short)UVar8 < 1) {
          UVar6 = 1;
        }
        if (2000 < (short)UVar8) {
          UVar6 = 2000;
        }
        pUVar21[6] = UVar6;
      }
      else {
        *(undefined2 *)((long)param + uVar29 * 2 + 0x488) = 0;
      }
      sVar5 = *(short *)((long)param + 0xcb6);
      sVar3 = *(short *)((long)param + (long)sVar5 * 2 + 0x4b6);
      sVar1 = *(short *)((long)param + 0x4b4);
      *(short *)((long)param + 0x4b4) = sVar3;
      iVar19 = (int)sVar1 + (int)sVar3 >> 1;
      *(short *)((long)param + 0xcb6) = sVar5 + 1;
      *(short *)((long)param + (long)sVar5 * 2 + 0x4b6) =
           (short)((uint)(iVar25 + *(short *)((long)param + 0x4b0) * iVar19 * 4) >> 0x10);
      if (*(short *)((long)param + 0x4b2) <= *(short *)((long)param + 0xcb6)) {
        *(undefined2 *)((long)param + 0xcb6) = 0;
      }
      uVar16 = iVar19 << 0xe;
      for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
        uVar14 = 0;
        if (lVar20 == 1) {
          uVar14 = uVar16;
        }
        uVar27 = 0;
        if (lVar20 == 0) {
          uVar27 = uVar16;
        }
        lVar30 = lVar20 * 0x188;
        for (lVar28 = -0x13; lVar28 != 0; lVar28 = lVar28 + 1) {
          uVar7 = *(short *)((long)param + lVar28 * 2 + 0x488) - 0x110;
          if (0x60 < uVar7) {
            uVar7 = 0x61;
          }
          iVar25 = (int)*(short *)((long)param + lVar28 * 2 + 0x4ae);
          uVar27 = uVar27 - *(short *)((long)param + (ulong)uVar7 * 2 + lVar30 + 0x22) * iVar25;
          uVar14 = uVar14 - *(short *)((long)param + (ulong)uVar7 * 2 + lVar30 + 0xe6) * iVar25;
        }
        if ((int)uVar27 < -0x1ffffffe) {
          uVar27 = 0xe0000001;
        }
        if (0x1ffffffe < (int)uVar27) {
          uVar27 = 0x1fffffff;
        }
        if ((int)uVar14 < -0x1ffffffe) {
          uVar14 = 0xe0000001;
        }
        if (0x1ffffffe < (int)uVar14) {
          uVar14 = 0x1fffffff;
        }
        IVar10 = fir((qsound_fir *)((long)param + lVar30 + 0xcb8),(INT16)((int)uVar14 >> 0xe));
        if (*(short *)((long)param + 0x1490) == 0x6b2) {
          uVar27 = fir((qsound_fir *)((long)param + lVar30 + 0xfc8),(INT16)(uVar27 >> 0xe));
        }
        else {
          uVar27 = uVar27 << 2;
        }
        d = (qsound_delay *)((long)param + lVar20 * 0x6e + 0x12d8);
        IVar10 = delay(d,IVar10);
        d_00 = (qsound_delay *)((long)param + lVar20 * 0x6e + 0x13b4);
        pIVar23 = (INT16 *)(ulong)uVar27;
        IVar11 = delay(d_00,uVar27);
        iVar25 = IVar11 + IVar10 + 0x2000 >> 0xe;
        if (iVar25 < -0x7ffe) {
          iVar25 = -0x7fff;
        }
        uVar9 = (undefined2)iVar25;
        if (0x7ffe < iVar25) {
          uVar9 = 0x7fff;
        }
        *(undefined2 *)((long)param + lVar20 * 2 + 0x1e) = uVar9;
        if (*(short *)((long)param + 0x1494) != 0) {
          delay_update(d);
          delay_update(d_00);
        }
      }
      *(undefined2 *)((long)param + 0x1494) = 0;
      iVar25 = *(int *)((long)param + 0x1498);
      *(int *)((long)param + 0x1498) = iVar25 + 1;
      if (4 < iVar25) {
        *(undefined4 *)((long)param + 0x1498) = 0;
        *(undefined2 *)((long)param + 0x1490) = *(undefined2 *)((long)param + 0x1492);
      }
    }
    else if (sVar5 == 0x4f) {
      for (lVar20 = -0x310; lVar20 != 0; lVar20 = lVar20 + 0x188) {
        *(undefined8 *)((long)param + lVar20 + 0xfc8) = 0x2d;
        pIVar12 = get_filter_table((qsound_chip *)(ulong)*(ushort *)((long)param + lVar20 + 0xfd0),
                                   (UINT16)pIVar23);
        if (pIVar12 != (INT16 *)0x0) {
          memcpy((void *)((long)param + lVar20 + 0xfd2),pIVar12,0x5a);
          pIVar23 = pIVar12;
        }
        *(undefined8 *)((long)param + lVar20 + 0x12d8) = 0x2c;
        pIVar12 = get_filter_table((qsound_chip *)(ulong)*(ushort *)((long)param + lVar20 + 0x12e0),
                                   (UINT16)pIVar23);
        if (pIVar12 != (INT16 *)0x0) {
          memcpy((void *)((long)param + lVar20 + 0x12e2),pIVar12,0x58);
          pIVar23 = pIVar12;
        }
      }
      *(undefined4 *)((long)param + 0x1490) = 0x6b206b2;
    }
    else if (*(int *)((long)param + 0x1498) < 2) {
      if (*(int *)((long)param + 0x1498) == 1) {
        *(undefined4 *)((long)param + 0x1498) = 2;
      }
      else {
        memset((void *)((long)param + 0x332),0,0x130);
        memset((void *)((long)param + 0x4b0),0,0xfe0);
        for (lVar20 = -0x13; lVar20 != 0; lVar20 = lVar20 + 1) {
          *(undefined2 *)((long)param + lVar20 * 2 + 0x488) = 0x120;
          *(undefined2 *)((long)param + lVar20 * 2 + 0x4ae) = 0;
        }
        for (lVar20 = 0; lVar20 != 0x100; lVar20 = lVar20 + 0x10) {
          *(undefined2 *)((long)param + 0x332 + lVar20) = 0x8000;
        }
        for (lVar20 = 0; lVar20 != 0x30; lVar20 = lVar20 + 0x10) {
          *(undefined2 *)((long)param + lVar20 + 0x436) = 0x8000;
        }
        if (sVar5 != 0x61a) {
          uVar9 = 0x39;
          uVar13 = 0x55a;
          uVar15 = 0xe11;
          pIVar23 = (INT16 *)0xdb2;
          uVar26 = 0x30;
          uVar24 = 0x2e;
        }
        else {
          *(undefined2 *)((long)param + 0xfd0) = 0xf73;
          *(undefined2 *)((long)param + 0x1158) = 0xfa4;
          uVar9 = 0x4f;
          uVar13 = 0x542;
          uVar15 = 0xfa4;
          pIVar23 = (INT16 *)0xf73;
          uVar24 = 0;
          uVar26 = 0;
        }
        *(ushort *)((long)param + 0x12d8) = (ushort)(sVar5 == 0x61a);
        *(undefined2 *)((long)param + 0x13b4) = uVar24;
        *(undefined4 *)((long)param + 0x1346) = 0x3fff0000;
        *(undefined2 *)((long)param + 0x1422) = uVar26;
        *(short *)((long)param + 0xcc0) = (short)pIVar23;
        *(undefined2 *)((long)param + 0xe48) = uVar15;
        *(undefined2 *)((long)param + 0x4ae) = uVar13;
        *(undefined2 *)((long)param + 0x1492) = uVar9;
        *(undefined2 *)((long)param + 0x12da) = 0x3fff;
        *(undefined2 *)((long)param + 0x13b6) = 0x3fff;
        *(undefined2 *)((long)param + 0x1424) = 0x3fff;
        *(undefined2 *)((long)param + 0x1494) = 1;
        *(undefined1 *)((long)param + 0x149c) = 0;
        *(undefined4 *)((long)param + 0x1498) = 1;
      }
    }
    else {
      *(undefined4 *)((long)param + 0x1498) = 0;
      *(undefined2 *)((long)param + 0x1490) = *(undefined2 *)((long)param + 0x1492);
    }
    (*outputs)[uVar22] = (int)*(short *)((long)param + 0x1e);
    outputs[1][uVar22] = (int)*(short *)((long)param + 0x20);
  }
  return;
}

Assistant:

static void qsoundc_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	struct qsound_chip* chip = (struct qsound_chip*)param;
	UINT32 curSmpl;
	
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		update_sample(chip);
		outputs[0][curSmpl] = chip->out[0];
		outputs[1][curSmpl] = chip->out[1];
	}
	
	return;
}